

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.h
# Opt level: O2

void anurbs::Point<3l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>> *this;
  string name;
  class_<anurbs::Point<3L>,_std::shared_ptr<anurbs::Point<3L>_>_> local_b0;
  char *local_a8 [4];
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  arg local_48;
  arg local_38;
  arg local_28;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::Point<3L>,_std::shared_ptr<anurbs::Point<3L>_>_>::class_<>
            (&local_b0,(m->super_object).super_handle.m_ptr,local_a8[0]);
  local_28.name = "location";
  local_28._8_1_ = 2;
  pybind11::detail::initimpl::constructor<const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_&>::
  execute<pybind11::class_<anurbs::Point<3L>,_std::shared_ptr<anurbs::Point<3L>_>_>,_pybind11::arg,_0>
            (&local_b0,&local_28);
  local_38.name = "location";
  local_38._8_1_ = 2;
  local_48.name = "text";
  local_48._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::
  execute<pybind11::class_<anurbs::Point<3L>,_std::shared_ptr<anurbs::Point<3L>_>_>,_pybind11::arg,_pybind11::arg,_0>
            (&local_b0,&local_38,&local_48);
  local_58 = Point<3L>::location;
  local_50 = 0;
  local_68 = Point<3L>::set_location;
  local_60 = 0;
  this = (class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>> *)
         pybind11::class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>>::
         def_property<Eigen::Matrix<double,1,3,1,1,3>(anurbs::Point<3l>::*)()const,void(anurbs::Point<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>const&)>
                   ((class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>> *)&local_b0,
                    "location",(offset_in_Model_to_subr *)&local_58,
                    (offset_in_Model_to_subr *)&local_68);
  local_78 = text_abi_cxx11_;
  local_70 = 0;
  local_88 = Point<3L>::set_text;
  local_80 = 0;
  pybind11::class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>>::
  def_property<std::__cxx11::string(anurbs::Point<3l>::*)()const,void(anurbs::Point<3l>::*)(std::__cxx11::string_const&)>
            (this,"text",(offset_in_Model_to_subr *)&local_78,(offset_in_Model_to_subr *)&local_88);
  pybind11::object::~object((object *)&local_b0);
  Model::register_python_data_type<anurbs::Point<3l>>(m,model);
  std::__cxx11::string::~string((string *)local_a8);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Point<TDimension>;
        using Holder = anurbs::Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // constructors
            .def(py::init<const Vector&>(), "location"_a)
            .def(py::init<const Vector&, const std::string&>(), "location"_a,
                "text"_a)
            // properties
            .def_property("location", &Type::location, &Type::set_location)
            .def_property("text", &Type::text, &Type::set_text)
        ;

        Model::register_python_data_type<Type>(m, model);
    }